

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O0

void grasshopper_encrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  grasshopper_w128_t *in_RCX;
  grasshopper_w128_t *in_RDX;
  grasshopper_w128_t *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  grasshopper_copy128(in_RDX,in_RSI);
  for (iVar1 = 0; iVar1 < 9; iVar1 = iVar1 + 1) {
    grasshopper_append128(in_RDX,(grasshopper_w128_t *)(in_RDI + (long)iVar1 * 0x10));
    grasshopper_append128multi
              (in_RCX,(grasshopper_w128_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (grasshopper_w128_t (*) [256])0x175707);
  }
  grasshopper_append128(in_RDX,(grasshopper_w128_t *)(in_RDI + 0x90));
  return;
}

Assistant:

void grasshopper_encrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    for (i = 0; i < 9; i++) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_enc128);
    }

    grasshopper_append128(target, &subkeys->k[9]);
}